

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O1

int gc_age(lua_State *L)

{
  StkId pTVar1;
  char *s;
  
  luaL_checkany(L,1);
  pTVar1 = L->ci->func;
  if ((short)pTVar1[1].tt_ < 0) {
    s = gc_age_gennames_rel +
        *(int *)(gc_age_gennames_rel + (ulong)((pTVar1[1].value_.gc)->marked & 7) * 4);
  }
  else {
    s = "no collectable";
  }
  lua_pushstring(L,s);
  return 1;
}

Assistant:

static int gc_age (lua_State *L) {
  TValue *o;
  luaL_checkany(L, 1);
  o = obj_at(L, 1);
  if (!iscollectable(o))
    lua_pushstring(L, "no collectable");
  else {
    static const char *gennames[] = {"new", "survival", "old0", "old1",
                                     "old", "touched1", "touched2"};
    GCObject *obj = gcvalue(o);
    lua_pushstring(L, gennames[getage(obj)]);
  }
  return 1;
}